

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cc
# Opt level: O2

int TVMBackendParallelBarrier(int task_id,TVMParallelGroupEnv *penv)

{
  if (penv->num_task == 1) {
    return 0;
  }
  __assert_fail("num_task == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/thread_pool.cc"
                ,0x1a3,"int TVMBackendParallelBarrier(int, TVMParallelGroupEnv *)");
}

Assistant:

int TVMBackendParallelBarrier(int task_id, TVMParallelGroupEnv *penv) {
  /* [RISCV-DLR] multi-threading is not supported */
  /*
  using tvm::runtime::kSyncStride;
  int num_task = penv->num_task;
  std::atomic<int>* sync_counter =
      reinterpret_cast<std::atomic<int>*>(penv->sync_handle);
  int old_counter = sync_counter[task_id * kSyncStride].fetch_add(
      1, std::memory_order_release);
  for (int i = 0; i < num_task; ++i) {
    if (i != task_id) {
      while (sync_counter[i * kSyncStride].load(
                 std::memory_order_relaxed) <= old_counter) {
        tvm::runtime::threading::Yield();
      }
    }
  }
  std::atomic_thread_fence(std::memory_order_acquire);
  */
  int num_task = penv->num_task;
#ifdef DEBUG_DLR
  printf("[ParallelBarrier] num task : %d\n", num_task);
#endif
  assert(num_task == 1);
  return 0;
}